

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O1

ProString * __thiscall
QMakeProject::expand
          (ProString *__return_storage_ptr__,QMakeProject *this,QString *expr,QString *where,
          int line)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  ProString *pPVar4;
  VisitReturn VVar5;
  ProFile *this_00;
  long in_FS_OFFSET;
  QStringView contents;
  ushort *tokPtr;
  QArrayDataPointer<ProString> local_58;
  char16_t *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->m_file = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->m_hash = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_string).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->m_offset = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_string).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_string).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  ProString::ProString(__return_storage_ptr__);
  contents.m_data = (expr->d).ptr;
  contents.m_size = (expr->d).size;
  this_00 = QMakeParser::parsedProBlock
                      ((this->super_QMakeEvaluator).m_parser,contents,0,where,line,ValueGrammar);
  if (this_00->m_ok == true) {
    (this->super_QMakeEvaluator).m_current.pro = this_00;
    (this->super_QMakeEvaluator).m_current.line = 0;
    local_38 = (this_00->m_proitems).d.ptr;
    if (local_38 == (char16_t *)0x0) {
      local_38 = (char16_t *)&QString::_empty;
    }
    local_58.d = (Data *)0x0;
    local_58.ptr = (ProString *)0x0;
    local_58.size = 0;
    VVar5 = QMakeEvaluator::expandVariableReferences
                      (&this->super_QMakeEvaluator,(ushort **)&local_38,1,(ProStringList *)&local_58
                       ,true);
    pPVar4 = local_58.ptr;
    if (VVar5 == ReturnError) {
      exit(3);
    }
    if (local_58.size != 0) {
      QString::operator=(&__return_storage_ptr__->m_string,(QString *)local_58.ptr);
      iVar1 = pPVar4->m_length;
      iVar2 = pPVar4->m_file;
      uVar3 = *(undefined4 *)&pPVar4->field_0x24;
      __return_storage_ptr__->m_offset = pPVar4->m_offset;
      __return_storage_ptr__->m_length = iVar1;
      __return_storage_ptr__->m_file = iVar2;
      *(undefined4 *)&__return_storage_ptr__->field_0x24 = uVar3;
      __return_storage_ptr__->m_hash = pPVar4->m_hash;
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  }
  ProFile::deref(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProString QMakeProject::expand(const QString &expr, const QString &where, int line)
{
    ProString ret;
    ProFile *pro = m_parser->parsedProBlock(QStringView(expr), 0, where, line,
                                            QMakeParser::ValueGrammar);
    if (pro->isOk()) {
        m_current.pro = pro;
        m_current.line = 0;
        const ushort *tokPtr = pro->tokPtr();
        ProStringList result;
        if (expandVariableReferences(tokPtr, 1, &result, true) == ReturnError)
            exit(3);
        if (!result.isEmpty())
            ret = result.at(0);
    }
    pro->deref();
    return ret;
}